

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

int run_test_ipc_listen_before_write(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  undefined8 *extraout_RDX;
  code *read_cb;
  long lVar3;
  char *pcVar4;
  uv_process_t uStack_a0;
  
  pcVar4 = "ipc_helper_listen_before_write";
  read_cb = on_read;
  run_ipc_test("ipc_helper_listen_before_write",on_read);
  if (local_conn_accepted == '\0') {
    run_test_ipc_listen_before_write_cold_1();
LAB_0015fd9e:
    run_test_ipc_listen_before_write_cold_2();
  }
  else {
    if (remote_conn_accepted == '\0') goto LAB_0015fd9e;
    if (read_cb_called == 1) {
      if (exit_cb_called == 1) {
        return 0;
      }
      goto LAB_0015fda8;
    }
  }
  run_test_ipc_listen_before_write_cold_3();
LAB_0015fda8:
  run_test_ipc_listen_before_write_cold_4();
  spawn_helper(&channel,&uStack_a0,pcVar4);
  uv_read_start((uv_stream_t *)&channel,on_alloc,read_cb);
  puVar2 = uv_default_loop();
  lVar3 = 0;
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    lVar3 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_ipc_test_cold_1();
  }
  run_ipc_test_cold_2();
  if (lVar3 != 0) {
    if (lVar3 < 0) {
      if (lVar3 != -0xfff) {
        pcVar4 = uv_strerror((int)lVar3);
        printf("error recving on channel: %s\n",pcVar4);
        abort();
      }
    }
    else {
      on_read_cold_1();
    }
  }
  free((void *)*extraout_RDX);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(ipc_listen_before_write) {
#if defined(NO_SEND_HANDLE_ON_PIPE)
  RETURN_SKIP(NO_SEND_HANDLE_ON_PIPE);
#endif
  int r = run_ipc_test("ipc_helper_listen_before_write", on_read);
  ASSERT(local_conn_accepted == 1);
  ASSERT(remote_conn_accepted == 1);
  ASSERT(read_cb_called == 1);
  ASSERT(exit_cb_called == 1);
  return r;
}